

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# editor.cpp
# Opt level: O2

void __thiscall tli_window_manager::Text::print(Text *this)

{
  int in_ECX;
  int in_EDX;
  Canvas *in_RSI;
  
  print((Text *)&this[-1].cursor_position_,in_RSI,in_EDX,in_ECX);
  return;
}

Assistant:

void Text::print(Canvas &canvas, int row, int col) const {
    int current_row = 0;
    int current_col = 0;
    for (int i = index_; i < buffer_.size(); ++i) {
        if (i == cursor_position_) {
            canvas[row + current_row][col + current_col] = '|';
            current_col++;
        }

        if (buffer_[i] == '\n') {
            current_row++;
            current_col = 0;
            if (current_row == height_) {
                break;
            }
        } else {
            canvas[row + current_row][col + current_col] = buffer_[i];
            current_col++;
        }
    }
    if (cursor_position_ == buffer_.size() && current_row < height_) {
        canvas[row + current_row][col + current_col] = '|';
    }
}